

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_column_reader.cpp
# Opt level: O0

void __thiscall
duckdb::ExpressionColumnReader::ExpressionColumnReader
          (ExpressionColumnReader *this,ClientContext *context,
          unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
          *child_reader_p,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_p)

{
  pointer pCVar1;
  ParquetReader *schema_p;
  pointer pEVar2;
  LogicalType *pLVar3;
  ColumnReader *in_RDX;
  ClientContext *in_RSI;
  undefined8 *in_RDI;
  vector<duckdb::LogicalType,_true> intermediate_types;
  allocator_type *in_stack_fffffffffffffec8;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffed0;
  initializer_list<duckdb::LogicalType> in_stack_fffffffffffffed8;
  LogicalType *local_100;
  ParquetReader *in_stack_ffffffffffffff58;
  LogicalType local_70 [24];
  LogicalType *local_58;
  undefined8 local_50;
  undefined1 local_48 [56];
  ClientContext *local_10;
  
  local_10 = in_RSI;
  pCVar1 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
           operator->((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                       *)in_stack_fffffffffffffed0);
  schema_p = ColumnReader::Reader(pCVar1);
  pCVar1 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
           operator->((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                       *)in_stack_fffffffffffffed0);
  ColumnReader::Schema(pCVar1);
  ColumnReader::ColumnReader(in_RDX,in_stack_ffffffffffffff58,(ParquetColumnSchema *)schema_p);
  *in_RDI = &PTR__ExpressionColumnReader_00c033f0;
  unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>::
  unique_ptr((unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
              *)0x8582c0);
  unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::unique_ptr
            ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *)
             in_stack_fffffffffffffed0,
             (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *)
             in_stack_fffffffffffffec8);
  duckdb::DataChunk::DataChunk((DataChunk *)(in_RDI + 0x40));
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffed0,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffec8);
  pEVar2 = std::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>::get
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                      in_stack_fffffffffffffed0);
  duckdb::ExpressionExecutor::ExpressionExecutor
            ((ExpressionExecutor *)(in_RDI + 0x49),local_10,pEVar2);
  unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>::
  unique_ptr((unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
              *)0x85837a);
  pCVar1 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
           operator->((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                       *)in_stack_fffffffffffffed0);
  pLVar3 = ColumnReader::Type(pCVar1);
  duckdb::LogicalType::LogicalType(local_70,pLVar3);
  local_58 = local_70;
  local_50 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x8583f8);
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffed8,in_stack_fffffffffffffec8);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x858429);
  local_100 = (LogicalType *)&local_58;
  do {
    local_100 = local_100 + -0x18;
    duckdb::LogicalType::~LogicalType(local_100);
  } while (local_100 != local_70);
  duckdb::DataChunk::Initialize
            ((Allocator *)(in_RDI + 0x40),*(vector **)(in_RDI[2] + 0x118),(ulong)local_48);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x8584a4);
  return;
}

Assistant:

ExpressionColumnReader::ExpressionColumnReader(ClientContext &context, unique_ptr<ColumnReader> child_reader_p,
                                               unique_ptr<Expression> expr_p)
    : ColumnReader(child_reader_p->Reader(), child_reader_p->Schema()), child_reader(std::move(child_reader_p)),
      expr(std::move(expr_p)), executor(context, expr.get()) {
	vector<LogicalType> intermediate_types {child_reader->Type()};
	intermediate_chunk.Initialize(reader.allocator, intermediate_types);
}